

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

void __thiscall
notch::core::FullyConnectedLayer::calcInducedLocalField(FullyConnectedLayer *this,Array *inputs)

{
  element_type *peVar1;
  size_t sVar2;
  size_t sVar3;
  float *b_begin;
  float *pfVar4;
  float *x_end;
  float *x_begin;
  float *pfVar5;
  float *b_end;
  
  peVar1 = (this->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sVar2 = (this->inducedLocalField)._M_size;
  if (sVar2 == peVar1->_M_size) {
    if (sVar2 == 0) goto LAB_00114c3a;
    pfVar4 = (this->inducedLocalField)._M_data;
    pfVar5 = peVar1->_M_data;
  }
  else {
    pfVar4 = (this->inducedLocalField)._M_data;
    if (pfVar4 != (float *)0x0) {
      operator_delete(pfVar4);
    }
    sVar2 = peVar1->_M_size;
    (this->inducedLocalField)._M_size = sVar2;
    pfVar4 = (float *)operator_new(sVar2 << 2);
    (this->inducedLocalField)._M_data = pfVar4;
    pfVar5 = peVar1->_M_data;
    if (pfVar5 == (float *)0x0) goto LAB_00114c3a;
    sVar2 = (this->inducedLocalField)._M_size;
  }
  memcpy(pfVar4,pfVar5,sVar2 << 2);
LAB_00114c3a:
  peVar1 = (this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  sVar2 = peVar1->_M_size;
  pfVar5 = peVar1->_M_data;
  pfVar4 = pfVar5 + sVar2;
  if (sVar2 == 0) {
    pfVar4 = (float *)0x0;
    pfVar5 = (float *)0x0;
  }
  sVar2 = inputs->_M_size;
  x_begin = inputs->_M_data;
  x_end = x_begin + sVar2;
  if (sVar2 == 0) {
    x_begin = (float *)0x0;
  }
  sVar3 = (this->inducedLocalField)._M_size;
  if (sVar2 == 0) {
    x_end = (float *)0x0;
  }
  b_begin = (this->inducedLocalField)._M_data;
  b_end = b_begin + sVar3;
  if (sVar3 == 0) {
    b_end = (float *)0x0;
    b_begin = (float *)0x0;
  }
  internal::gemv<float*,float_const*,float*>(pfVar5,pfVar4,x_begin,x_end,b_begin,b_end);
  return;
}

Assistant:

void calcInducedLocalField(const Array &inputs) {
        inducedLocalField = *bias; // will be added and overwritten
        internal::gemv(
             std::begin(*weights), std::end(*weights), std::begin(inputs),
             std::end(inputs), std::begin(inducedLocalField),
             std::end(inducedLocalField));
    }